

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O0

void __thiscall
dap::BasicTypeInfo<dap::StoppedEvent>::destruct(BasicTypeInfo<dap::StoppedEvent> *this,void *ptr)

{
  void *ptr_local;
  BasicTypeInfo<dap::StoppedEvent> *this_local;
  
  StoppedEvent::~StoppedEvent((StoppedEvent *)ptr);
  return;
}

Assistant:

inline void destruct(void* ptr) const override {
    reinterpret_cast<T*>(ptr)->~T();
  }